

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBody.cpp
# Opt level: O3

void __thiscall
chrono::ChBody::ComputeNF
          (ChBody *this,double U,double V,double W,ChVectorDynamic<> *Qi,double *detJ,
          ChVectorDynamic<> *F,ChVectorDynamic<> *state_x,ChVectorDynamic<> *state_w)

{
  double *__dest;
  double dVar1;
  double dVar2;
  uint uVar3;
  char *__function;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double dVar11;
  undefined1 auVar12 [16];
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  double *pdVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  ChVector<double> absF;
  ChVector<double> absT;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  ChCoordsys<double> local_e8;
  undefined1 local_a8 [16];
  double local_98;
  ChVectorDynamic<> *local_90;
  undefined8 local_88;
  long local_78;
  ChVector<double> local_68;
  ChVector<double> local_48;
  
  local_e8.pos.m_data[0] =
       (double)(F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  local_e8.rot.m_data[3] =
       (double)(F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  local_e8.pos.m_data[1] = 1.48219693752374e-323;
  local_e8.rot.m_data[1] = 0.0;
  if (2 < (long)local_e8.rot.m_data[3]) {
    local_e8.rot.m_data[0] = (double)F;
    ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
              (&local_68,
               (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                *)&local_e8,(type *)0x0);
    local_e8.rot.m_data[3] =
         (double)(F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_rows;
    local_e8.pos.m_data[0] =
         (double)((F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                  m_data + 3);
    local_e8.pos.m_data[1] = 1.48219693752374e-323;
    local_e8.rot.m_data[1] = 1.48219693752374e-323;
    if (5 < (long)local_e8.rot.m_data[3]) {
      local_e8.rot.m_data[0] = (double)F;
      ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
                (&local_48,
                 (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                  *)&local_e8,(type *)0x0);
      local_e8.pos.m_data[2] = 0.0;
      local_e8.pos.m_data[0] = 0.0;
      local_e8.pos.m_data[1] = 0.0;
      local_e8.rot.m_data[0] = 1.0;
      local_e8.rot.m_data[1] = 0.0;
      local_e8.rot.m_data[2] = 0.0;
      local_e8.rot.m_data[3] = 0.0;
      if (state_x == (ChVectorDynamic<> *)0x0) {
        if (&(this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord ==
            &local_e8) {
          auVar8 = ZEXT816(0x3ff0000000000000);
          dVar13 = 0.0;
          dVar17 = 0.0;
          dVar21 = 0.0;
          pdVar25 = (double *)0x0;
        }
        else {
          local_e8.pos.m_data[0] =
               (this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord.pos
               .m_data[0];
          local_e8.pos.m_data[1] =
               (this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord.pos
               .m_data[1];
          local_e8.pos.m_data[2] =
               (this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord.pos
               .m_data[2];
          local_e8.rot.m_data[0] =
               (this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord.rot
               .m_data[0];
          pdVar25 = (double *)
                    (this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.
                    coord.pos.m_data[0];
          dVar21 = (this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord
                   .pos.m_data[1];
          dVar17 = (this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord
                   .pos.m_data[2];
          auVar8._8_8_ = 0;
          auVar8._0_8_ = (this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>
                         .coord.rot.m_data[0];
          local_e8.rot.m_data[1] =
               (this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord.rot
               .m_data[1];
          local_e8.rot.m_data[2] =
               (this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord.rot
               .m_data[2];
          dVar13 = (this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord
                   .rot.m_data[2];
          local_e8.rot.m_data[3] =
               (this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord.rot
               .m_data[3];
        }
LAB_0050a656:
        local_a8._8_8_ = local_68.m_data[1];
        local_a8._0_8_ = local_68.m_data[0];
        auVar27._8_8_ = 0;
        auVar27._0_8_ = local_68.m_data[2];
        auVar7 = vmulsd_avx512f(auVar8,auVar8);
        auVar9._8_8_ = 0x8000000000000000;
        auVar9._0_8_ = 0x8000000000000000;
        auVar8 = vxorpd_avx512vl(auVar8,auVar9);
        auVar35 = ZEXT816(0x4000000000000000);
        local_98 = local_68.m_data[2];
        dVar11 = auVar8._0_8_;
        dVar2 = local_e8.rot.m_data[1] * dVar13 - local_e8.rot.m_data[3] * dVar11;
        dVar1 = local_e8.rot.m_data[1] * dVar13 + local_e8.rot.m_data[3] * dVar11;
        auVar30._8_8_ = 0;
        auVar30._0_8_ = local_68.m_data[1];
        auVar22._8_8_ = 0;
        auVar22._0_8_ = V - dVar21;
        auVar33._8_8_ = 0;
        auVar33._0_8_ = local_68.m_data[1] * (W - dVar17);
        auVar8 = vfmsub231sd_fma(auVar33,auVar22,auVar27);
        auVar18._8_8_ = 0;
        auVar18._0_8_ = W - dVar17;
        auVar28._8_8_ = 0;
        auVar28._0_8_ = local_68.m_data[2] * (U - (double)pdVar25);
        auVar9 = vfmsub231sd_fma(auVar28,local_a8,auVar18);
        local_48.m_data[0] = auVar8._0_8_ + local_48.m_data[0];
        auVar19._8_8_ = 0;
        auVar19._0_8_ = local_68.m_data[0] * (V - dVar21);
        auVar26._8_8_ = 0;
        auVar26._0_8_ = U - (double)pdVar25;
        auVar8 = vfmsub231sd_fma(auVar19,auVar26,auVar30);
        local_48.m_data[1] = auVar9._0_8_ + local_48.m_data[1];
        local_48.m_data[2] = auVar8._0_8_ + local_48.m_data[2];
        auVar31._8_8_ = 0;
        auVar31._0_8_ = dVar13 * dVar13;
        auVar8 = vaddsd_avx512f(auVar7,auVar31);
        auVar29._8_8_ = 0;
        auVar29._0_8_ = local_e8.rot.m_data[1] * local_e8.rot.m_data[1];
        auVar9 = vaddsd_avx512f(auVar7,auVar29);
        auVar8 = vfmadd213sd_avx512f(auVar8,auVar35,ZEXT816(0xbff0000000000000));
        auVar10 = vfmadd213sd_avx512f(auVar9,auVar35,ZEXT816(0xbff0000000000000));
        auVar12._8_8_ = 0;
        auVar12._0_8_ = dVar1 + dVar1;
        auVar23._8_8_ = 0;
        auVar23._0_8_ = local_48.m_data[0];
        auVar32._8_8_ = 0;
        auVar32._0_8_ = auVar8._0_8_ * local_48.m_data[1];
        auVar9 = vfmadd231sd_fma(auVar32,auVar23,auVar12);
        dVar1 = dVar13 * local_e8.rot.m_data[3] - local_e8.rot.m_data[1] * dVar11;
        dVar21 = local_e8.rot.m_data[1] * dVar11 + dVar13 * local_e8.rot.m_data[3];
        auVar36._8_8_ = 0;
        auVar36._0_8_ = (dVar2 + dVar2) * local_48.m_data[1];
        auVar8 = vfmadd231sd_fma(auVar36,auVar23,auVar10);
        dVar17 = dVar13 * dVar11 + local_e8.rot.m_data[1] * local_e8.rot.m_data[3];
        dVar13 = local_e8.rot.m_data[1] * local_e8.rot.m_data[3] - dVar13 * dVar11;
        auVar16._8_8_ = 0;
        auVar16._0_8_ = dVar17 + dVar17;
        auVar20._8_8_ = 0;
        auVar20._0_8_ = local_48.m_data[2];
        auVar8 = vfmadd213sd_fma(auVar16,auVar20,auVar8);
        auVar10._8_8_ = 0;
        auVar10._0_8_ = dVar1 + dVar1;
        auVar9 = vfmadd213sd_fma(auVar10,auVar20,auVar9);
        auVar14._8_8_ = 0;
        auVar14._0_8_ = local_48.m_data[1] * (dVar21 + dVar21);
        auVar15._8_8_ = 0;
        auVar15._0_8_ = dVar13 + dVar13;
        auVar24._8_8_ = 0;
        auVar24._0_8_ = local_48.m_data[0];
        auVar10 = vfmadd231sd_fma(auVar14,auVar24,auVar15);
        auVar34._8_8_ = 0;
        auVar34._0_8_ = local_e8.rot.m_data[3] * local_e8.rot.m_data[3];
        auVar7 = vaddsd_avx512f(auVar7,auVar34);
        local_100 = auVar8._0_8_;
        local_f8 = auVar9._0_8_;
        auVar8 = vfmadd213sd_avx512f(auVar7,auVar35,ZEXT816(0xbff0000000000000));
        auVar7._8_8_ = 0;
        auVar7._0_8_ = local_48.m_data[2];
        auVar8 = vfmadd213sd_fma(auVar8,auVar7,auVar10);
        local_f0 = auVar8._0_8_;
        uVar6 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_rows;
        if (2 < (long)uVar6) {
          pdVar25 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                    m_data;
          uVar4 = 3;
          if (((ulong)pdVar25 & 7) == 0) {
            uVar3 = -((uint)((ulong)pdVar25 >> 3) & 0x1fffffff) & 7;
            if (uVar3 < 3) {
              uVar4 = uVar3;
            }
            if (uVar3 != 0) goto LAB_0050a7e0;
          }
          else {
LAB_0050a7e0:
            memcpy(pdVar25,local_a8,(ulong)(uVar4 * 8));
          }
          if (uVar4 < 3) {
            uVar5 = (ulong)(uVar4 << 3);
            memcpy((void *)((long)pdVar25 + uVar5),local_a8 + uVar5,0x18 - uVar5);
          }
          if (5 < uVar6) {
            __dest = pdVar25 + 3;
            uVar4 = 3;
            if (((ulong)__dest & 7) == 0) {
              uVar3 = -((uint)((ulong)__dest >> 3) & 0x1fffffff) & 7;
              if (uVar3 < 3) {
                uVar4 = uVar3;
              }
              if (uVar3 == 0) goto LAB_0050a860;
            }
            memcpy(__dest,&local_100,(ulong)(uVar4 * 8));
LAB_0050a860:
            if (uVar4 < 3) {
              uVar6 = (ulong)(uVar4 << 3);
              memcpy((void *)((long)pdVar25 + uVar6 + 0x18),(void *)((long)&local_100 + uVar6),
                     0x18 - uVar6);
            }
            *detJ = 1.0;
            return;
          }
        }
      }
      else {
        local_78 = (state_x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                   m_storage.m_rows;
        local_a8._8_8_ = 7;
        local_a8._0_8_ =
             (state_x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data;
        local_88 = 0;
        local_90 = state_x;
        if (6 < local_78) {
          ChCoordsys<double>::operator=
                    (&local_e8,
                     (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                      *)local_a8);
          auVar8._8_8_ = 0;
          auVar8._0_8_ = local_e8.rot.m_data[0];
          dVar13 = local_e8.rot.m_data[2];
          pdVar25 = (double *)local_e8.pos.m_data[0];
          dVar21 = local_e8.pos.m_data[1];
          dVar17 = local_e8.pos.m_data[2];
          goto LAB_0050a656;
        }
      }
      __function = 
      "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
      ;
      goto LAB_0050a8d2;
    }
  }
  local_e8.pos.m_data[1] = 1.48219693752374e-323;
  __function = 
  "Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
  ;
  local_e8.rot.m_data[0] = (double)F;
LAB_0050a8d2:
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,__function);
}

Assistant:

void ChBody::ComputeNF(
    const double U,              // x coordinate of application point in absolute space
    const double V,              // y coordinate of application point in absolute space
    const double W,              // z coordinate of application point in absolute space
    ChVectorDynamic<>& Qi,       // Return result of N'*F  here, maybe with offset block_offset
    double& detJ,                // Return det[J] here
    const ChVectorDynamic<>& F,  // Input F vector, size is 6, it is {Force,Torque} in absolute coords.
    ChVectorDynamic<>* state_x,  // if != 0, update state (pos. part) to this, then evaluate Q
    ChVectorDynamic<>* state_w   // if != 0, update state (speed part) to this, then evaluate Q
) {
    ChVector<> abs_pos(U, V, W);
    ChVector<> absF(F.segment(0, 3));
    ChVector<> absT(F.segment(3, 3));
    ChVector<> body_absF;
    ChVector<> body_locT;
    ChCoordsys<> bodycoord;
    if (state_x)
        bodycoord = state_x->segment(0, 7);  // the numerical jacobian algo might change state_x
    else
        bodycoord = this->coord;

    // compute Q components F,T, given current state of body 'bodycoord'. Note T in Q is in local csys, F is an abs csys
    body_absF = absF;
    body_locT = bodycoord.rot.RotateBack(absT + ((abs_pos - bodycoord.pos) % absF));
    Qi.segment(0, 3) = body_absF.eigen();
    Qi.segment(3, 3) = body_locT.eigen();
    detJ = 1;  // not needed because not used in quadrature.
}